

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O0

void __thiscall QMakeParser::warnOperator(QMakeParser *this,char *msg)

{
  QMakeParser *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QString *in_stack_fffffffffffffe88;
  QMakeParser *data;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  QString *in_stack_fffffffffffffea8;
  QString *in_stack_fffffffffffffeb0;
  undefined1 local_148 [24];
  storage_type *local_130;
  QChar in_stack_fffffffffffffede;
  undefined1 local_120 [54];
  QChar local_ea;
  storage_type *local_e8;
  undefined1 local_d8 [24];
  storage_type *local_c0;
  undefined1 local_b0 [54];
  QChar local_7a;
  storage_type *local_78;
  undefined1 local_68 [24];
  storage_type *local_50;
  undefined1 local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  data = in_RDI;
  if (in_RDI->m_invert != 0) {
    QByteArrayView::QByteArrayView<23ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (char (*) [23])in_RDI);
    QVar1.m_data = local_50;
    QVar1.m_size = (qsizetype)local_40;
    QString::fromLatin1(QVar1);
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (char **)data);
    QVar2.m_data = local_78;
    QVar2.m_size = (qsizetype)local_68;
    QString::fromLatin1(QVar2);
    QChar::QChar<char16_t,_true>(&local_7a,L' ');
    QString::arg<QString,_true>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffede);
    languageWarning(in_RDI,in_stack_fffffffffffffe88);
    QString::~QString((QString *)0x314699);
    QString::~QString((QString *)0x3146a6);
    QString::~QString((QString *)0x3146b3);
    in_RDI->m_invert = 0;
  }
  if (in_RDI->m_operator == AndOperator) {
    QByteArrayView::QByteArrayView<23ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (char (*) [23])data);
    QVar3.m_data = local_c0;
    QVar3.m_size = (qsizetype)local_b0;
    QString::fromLatin1(QVar3);
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (char **)data);
    QVar4.m_data = local_e8;
    QVar4.m_size = (qsizetype)local_d8;
    QString::fromLatin1(QVar4);
    QChar::QChar<char16_t,_true>(&local_ea,L' ');
    QString::arg<QString,_true>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffede);
    languageWarning(in_RDI,in_stack_fffffffffffffe88);
    QString::~QString((QString *)0x31478a);
    QString::~QString((QString *)0x314797);
    QString::~QString((QString *)0x3147a4);
    in_RDI->m_operator = NoOperator;
  }
  else if (in_RDI->m_operator == OrOperator) {
    QByteArrayView::QByteArrayView<22ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (char (*) [22])data);
    QVar5.m_data = local_130;
    QVar5.m_size = (qsizetype)local_120;
    QString::fromLatin1(QVar5);
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (char **)data);
    QVar6.m_data = (storage_type *)in_stack_fffffffffffffea8;
    QVar6.m_size = (qsizetype)local_148;
    QString::fromLatin1(QVar6);
    QChar::QChar<char16_t,_true>((QChar *)&stack0xfffffffffffffea6,L' ');
    QString::arg<QString,_true>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffede);
    languageWarning(in_RDI,in_stack_fffffffffffffe88);
    QString::~QString((QString *)0x314853);
    QString::~QString((QString *)0x31485d);
    QString::~QString((QString *)0x314867);
    in_RDI->m_operator = NoOperator;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeParser::warnOperator(const char *msg)
{
    if (m_invert) {
        languageWarning(fL1S("Stray NOT operator %1.").arg(fL1S(msg)));
        m_invert = 0;
    }
    if (m_operator == AndOperator) {
        languageWarning(fL1S("Stray AND operator %1.").arg(fL1S(msg)));
        m_operator = NoOperator;
    } else if (m_operator == OrOperator) {
        languageWarning(fL1S("Stray OR operator %1.").arg(fL1S(msg)));
        m_operator = NoOperator;
    }
}